

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseUpgrader.cpp
# Opt level: O3

void migrate_version(string_view path)

{
  source_loc loc;
  source_loc loc_00;
  bool bVar1;
  int iVar2;
  logger *plVar3;
  _Cmpt *__p;
  string_view_t fmt;
  string_view path_00;
  string_view filename;
  string version;
  json db_json;
  string db_name;
  string prev_version;
  string most_recent;
  path db_root;
  undefined1 local_178 [8];
  json_value local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  pointer local_158;
  undefined1 uStack_150;
  undefined7 uStack_14f;
  undefined1 uStack_148;
  undefined8 uStack_147;
  undefined1 local_138 [8];
  json_value local_130;
  long *local_128;
  char *local_120;
  long local_118 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  long *local_e8;
  object_t *local_e0;
  long local_d8 [2];
  _Cmpt local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  path local_70;
  
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"1.5.0","");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            ((path *)local_178,&local_80);
  std::experimental::filesystem::v1::__cxx11::path::parent_path();
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_178);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            (&local_c8.super_path,&local_80);
  if (local_c8.super_path._M_pathname._M_string_length == 0) {
    local_170.object = (object_t *)0x0;
    local_168._M_local_buf[0] = '\0';
    local_158 = (pointer)0x0;
    uStack_150 = 0;
    uStack_14f = 0;
    uStack_148 = 0;
    uStack_147 = 0;
    local_178 = (undefined1  [8])(local_178 + 0x10);
  }
  else {
    __p = &local_c8;
    if (local_c8.super_path._M_type == _Multi) {
      __p = local_c8.super_path._M_cmpts.
            super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
    }
    std::experimental::filesystem::v1::__cxx11::path::path((path *)local_178,&__p->super_path);
  }
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,local_178,
             (pointer)((long)local_178 + (long)&(local_170.object)->_M_t));
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_178);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_c8.super_path);
  do {
    path_00._M_str = local_120;
    path_00._M_len = (size_t)&local_70;
    read_json((path *)local_178,path_00);
    local_138[0] = local_178[0];
    local_130 = local_170;
    local_178 = (undefined1  [8])((ulong)local_178 & 0xffffffffffffff00);
    local_170.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_178 + 8),null);
    extract_version((string *)local_178,(json *)local_138);
    if (local_170.object == (object_t *)local_108._M_string_length) {
      if (local_170.object != (object_t *)0x0) {
        iVar2 = bcmp((void *)local_178,local_108._M_dataplus._M_p,local_170.number_unsigned);
        if (iVar2 != 0) goto LAB_00139edb;
      }
      plVar3 = spdlog::default_logger_raw();
      local_c8.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
      local_c8.super_path._M_pathname._M_string_length = 0;
      local_c8.super_path._M_pathname.field_2._M_allocated_capacity = 0;
      loc.funcname = (char *)0x0;
      loc.filename = (char *)0x0;
      loc.line = 0;
      loc._12_4_ = 0;
      spdlog::logger::log<char[47],_nullptr>
                (plVar3,loc,err,(char (*) [47])"Upgrade procedure failed. Trying to proceed...");
LAB_00139fb6:
      bVar1 = false;
    }
    else {
      if ((object_t *)local_108._M_string_length != (object_t *)0x0) {
LAB_00139edb:
        plVar3 = spdlog::default_logger_raw();
        local_c8.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
        local_c8.super_path._M_pathname._M_string_length = 0;
        local_c8.super_path._M_pathname.field_2._M_allocated_capacity = 0;
        loc_00.funcname = (char *)0x0;
        loc_00.filename = (char *)0x0;
        loc_00.line = 0;
        loc_00._12_4_ = 0;
        fmt.size_ = 0x12;
        fmt.data_ = "UPGRADE: {} -> {}.";
        spdlog::logger::log<std::__cxx11::string,std::__cxx11::string>
                  (plVar3,loc_00,info,fmt,&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
      }
      if (local_170.object == local_e0) {
        if (local_170.object != (object_t *)0x0) {
          iVar2 = bcmp((void *)local_178,local_e8,local_170.number_unsigned);
          if (iVar2 != 0) goto LAB_00139f59;
        }
        goto LAB_00139fb6;
      }
LAB_00139f59:
      iVar2 = std::__cxx11::string::compare((char *)local_178);
      if (iVar2 == 0) {
        upgrade_v1_0_0((json *)local_138);
      }
      iVar2 = std::__cxx11::string::compare((char *)local_178);
      if (iVar2 == 0) {
        upgrade_v1_3_2(&local_70,(json *)local_138);
      }
      std::__cxx11::string::_M_assign((string *)&local_108);
      bVar1 = true;
      filename._M_str = (char *)local_128;
      filename._M_len = (size_t)local_120;
      save_json(&local_70,filename,(json *)local_138);
    }
    if (local_178 != (undefined1  [8])(local_178 + 0x10)) {
      operator_delete((void *)local_178,
                      CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]) + 1)
      ;
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_138 + 8),local_138[0]);
    if (!bVar1) {
      if (local_128 != local_118) {
        operator_delete(local_128,local_118[0] + 1);
      }
      std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,
                        CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                 local_108.field_2._M_local_buf[0]) + 1);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8,local_d8[0] + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void migrate_version(std::string_view path) {
    std::string most_recent = "1.5.0";
    std::string prev_version;
    auto db_root = fs::path(path).parent_path();
    auto db_name = std::string(fs::path(path).filename());
    while (true) {
        json db_json = std::move(read_json(db_root, db_name));
        std::string version = extract_version(db_json);
        if (version == prev_version) {
            spdlog::error("Upgrade procedure failed. Trying to proceed...");
            break;
        }
        if (version != prev_version && !prev_version.empty()) {
            spdlog::info("UPGRADE: {} -> {}.", prev_version, version);
        }
        if (version == most_recent) {
            break;
        }
        if (version == "1.0.0") {
            upgrade_v1_0_0(&db_json);
        }
        if (version == "1.3.2") {
            upgrade_v1_3_2(db_root, &db_json);
        }
        prev_version = version;
        save_json(db_root, db_name, db_json);
    }
}